

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsBrokerFree(HelicsBroker broker)

{
  undefined8 local_20;
  undefined8 local_18;
  
  if ((broker != (HelicsBroker)0x0) && (*(int *)((long)broker + 0x14) == -0x5cb982e0)) {
    *(undefined4 *)((long)broker + 0x14) = 0;
    getMasterHolder();
    MasterObjectHolder::clearBroker(local_20,*(int *)((long)broker + 0x10));
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  helics::BrokerFactory::cleanUpBrokers();
  return;
}

Assistant:

void helicsBrokerFree(HelicsBroker broker)
{
    auto* brokerObj = helics::getBrokerObject(broker, nullptr);
    if (brokerObj != nullptr) {
        brokerObj->valid = 0;
        getMasterHolder()->clearBroker(brokerObj->index);
    }
    helics::BrokerFactory::cleanUpBrokers();
}